

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[65],kj::CappedArray<char,17ul>&,char_const(&)[6],kj::StringTree,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [65],
          CappedArray<char,_17UL> *params_1,char (*params_2) [6],StringTree *params_3,
          char (*params_4) [3])

{
  char (*value) [65];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [6];
  StringTree *pSVar1;
  char (*value_02) [3];
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringTree *local_38;
  char (*params_local_4) [3];
  StringTree *params_local_3;
  char (*params_local_2) [6];
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [65];
  
  local_38 = params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (char (*) [6])params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [65])__return_storage_ptr__;
  value = ::const((char (*) [65])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[65]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_00);
  value_01 = ::const((char (*) [6])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_01);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_02 = ::const((char (*) [3])local_38);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)pSVar1,(StringTree *)&local_78,in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}